

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * cargo_get_usage(cargo_t ctx,cargo_usage_t flags)

{
  char cVar1;
  ulong uVar2;
  size_t sVar3;
  cargo_opt_t *pcVar4;
  cargo_t pcVar5;
  cargo_group_t *pcVar6;
  uint uVar7;
  size_t sVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  char *__s;
  size_t sVar12;
  char **namebuf;
  char *pcVar13;
  byte bVar14;
  long lVar15;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  cargo_usage_t in_stack_ffffffffffffff48;
  uint local_b4;
  cargo_astr_t str;
  char *opt_s;
  cargo_group_t *local_78;
  char *b;
  char *b_1;
  size_t prev_offset;
  cargo_astr_t local_58;
  ulong local_38;
  undefined8 uVar16;
  
  b = (char *)0x0;
  if (ctx == (cargo_t)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x15da,"const char *cargo_get_usage(cargo_t, cargo_usage_t)");
  }
  if ((flags & CARGO_USAGE_HIDE_SHORT) == CARGO_USAGE_FULL) {
    b_1 = (char *)0x0;
    _cargo_add_help_if_missing(ctx);
    _cargo_add_orphans_to_default_group(ctx);
    local_58.diff = 0;
    local_58.l = 0;
    local_58.offset = 0;
    pcVar13 = ctx->progname;
    local_58.s = &b_1;
    if ((flags >> 8 & 1) == 0) {
      __s = strrchr(pcVar13,0x2f);
      if ((__s == (char *)0x0) && (__s = strrchr(pcVar13,0x5c), __s == (char *)0x0)) {
        __s = pcVar13;
      }
      sVar12 = strspn(__s,"/\\");
      pcVar13 = __s + sVar12;
    }
    cargo_aappendf(&local_58,"Usage: %s",pcVar13);
    if (-1 < (char)flags) {
      local_78 = (cargo_group_t *)local_58.offset;
      _cargo_get_short_option_usages(ctx,&local_58,local_58.offset,0);
      prev_offset = 0;
      opt_s = (char *)0x0;
      uVar18 = 0;
      while (uVar18 < ctx->mutex_group_count) {
        pcVar6 = ctx->mutex_groups;
        uVar17 = uVar18;
        if ((pcVar6[uVar18].flags & 0x30) == 0) {
          if (pcVar6[uVar18].metavar == (char *)0x0) {
            if ((pcVar6[uVar18].flags & 4) == 0) {
              local_38 = uVar18;
              for (uVar21 = 0; uVar2 = pcVar6[uVar18].opt_count, uVar21 < uVar2; uVar21 = uVar21 + 1
                  ) {
                sVar8 = pcVar6[uVar18].flags;
                str.l = 0;
                str.offset = 0;
                str.diff = 0;
                str.s = &opt_s;
                sVar3 = pcVar6[uVar18].option_indices[uVar21];
                pcVar4 = ctx->options;
                if (uVar21 == 0) {
                  pcVar13 = " {";
                  if ((sVar8 & 1) == 0) {
                    pcVar13 = " [";
                  }
                  cargo_aappendf(&str,"%s",pcVar13);
                }
                iVar11 = _cargo_get_short_option_usage
                                   (ctx,pcVar4 + sVar3,&str,pcVar4[sVar3].positional,0);
                uVar17 = local_38;
                if (iVar11 < 0) goto LAB_00106c4c;
                if (uVar21 == uVar2 - 1) {
                  pcVar13 = "}";
                  if ((sVar8 & 1) == 0) {
                    pcVar13 = "]";
                  }
                  cargo_aappendf(&str,"%s",pcVar13);
                }
                else {
                  cargo_aappendf(&str,", ");
                }
                _cargo_fit_on_short_usage_line
                          (ctx,&local_58,(size_t)local_78,local_58.offset,str.offset,&prev_offset);
                if (opt_s != (char *)0x0) {
                  cargo_aappendf(&local_58,"%s");
                  _cargo_xfree(&opt_s);
                }
              }
            }
          }
          else {
            str.diff = 0;
            str.l = 0;
            str.offset = 0;
            str.s = &opt_s;
            cargo_aappendf(&str," %s",pcVar6[uVar18].metavar);
            _cargo_fit_on_short_usage_line
                      (ctx,&local_58,(size_t)local_78,local_58.offset,str.offset,&prev_offset);
            if (opt_s != (char *)0x0) {
              cargo_aappendf(&local_58,"%s");
              _cargo_xfree(&opt_s);
            }
          }
        }
        uVar18 = uVar17 + 1;
      }
LAB_00106c4c:
      _cargo_get_short_option_usages(ctx,&local_58,(size_t)local_78,1);
    }
    b_1 = (char *)_cargo_realloc(b_1,(size_t)((long)(char **)local_58.offset + 1));
    if (b_1 == (char *)0x0) {
      return (char *)0x0;
    }
    _cargo_xfree(&ctx->short_usage);
    ctx->short_usage = b_1;
    pcVar13 = b_1;
    if (b_1 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  else {
    pcVar13 = (char *)0x0;
  }
  if ((flags & CARGO_USAGE_SHORT) != CARGO_USAGE_FULL) {
    return pcVar13;
  }
  namebuf = (char **)_cargo_malloc(ctx->max_width);
  str.s = namebuf;
  if (namebuf != (char **)0x0) {
    lVar22 = 0;
    lVar20 = 0;
    lVar19 = 0;
    local_b4 = 0;
    for (uVar18 = 0; uVar18 < ctx->opt_count; uVar18 = uVar18 + 1) {
      pcVar4 = ctx->options;
      if ((*(byte *)((long)&pcVar4->flags + lVar22) & 0x20) == 0) {
        iVar11 = *(int *)((long)pcVar4->mutex_group_idxs + lVar22 + -0x18);
        lVar15 = lVar20;
        if (iVar11 == 0) {
          lVar15 = lVar19;
        }
        lVar9 = lVar15 + 1;
        if (iVar11 == 0) {
          lVar19 = lVar15 + 1;
          lVar9 = lVar20;
        }
        lVar20 = lVar9;
        uVar10 = _cargo_get_option_name_str
                           (ctx,(cargo_opt_t *)((long)pcVar4->name + lVar22),(char *)namebuf,
                            ctx->max_width);
        if ((int)uVar10 < 0) {
          local_b4 = 0xffffffff;
          break;
        }
        uVar7 = local_b4;
        if ((int)local_b4 < (int)uVar10) {
          uVar7 = uVar10;
        }
        if (uVar10 < 0x29) {
          local_b4 = uVar7;
        }
      }
      lVar22 = lVar22 + 0x128;
    }
    _cargo_xfree(&str);
    if (-1 < (int)local_b4) {
      str.s = &b;
      str.l = 0x400;
      str.offset = 0;
      bVar14 = pcVar13 == (char *)0x0 | (byte)((flags & CARGO_USAGE_HIDE_SHORT) >> 6);
      uVar16 = CONCAT71((int7)((ulong)str.s >> 8),bVar14);
      if (bVar14 == 0) {
        cargo_aappendf(&str,"%s\n");
      }
      pcVar5 = (cargo_t)ctx->description;
      if (((pcVar5 == (cargo_t)0x0) || ((flags & CARGO_USAGE_HIDE_DESCRIPTION) != CARGO_USAGE_FULL))
         || (*(char *)&pcVar5->progname == '\0')) {
LAB_00106e2e:
        lVar22 = 0;
        uVar18 = 0;
        while( true ) {
          iVar11 = (int)uVar16;
          if (ctx->mutex_group_count <= uVar18) break;
          pcVar6 = ctx->mutex_groups;
          if ((*(byte *)((long)&pcVar6->flags + lVar22) & 2) != 0) {
            if (*(long *)((long)&pcVar6->title + lVar22) != 0) {
              cargo_aappendf(&str,"\n%s:\n");
            }
            iVar11 = _cargo_get_group_description
                               (ctx,&str,(cargo_group_t *)((long)&pcVar6->name + lVar22),iVar11);
            if ((iVar11 != 0) ||
               (iVar11 = _cargo_print_options
                                   (ctx,*(size_t **)((long)&pcVar6->option_indices + lVar22),
                                    *(size_t *)((long)&pcVar6->opt_count + lVar22),1,&str,local_b4,1
                                    ,flags,in_stack_ffffffffffffff48), iVar11 != 0))
            goto LAB_001070bc;
            uVar16 = 0;
            iVar11 = _cargo_print_options
                               (ctx,*(size_t **)((long)&pcVar6->option_indices + lVar22),
                                *(size_t *)((long)&pcVar6->opt_count + lVar22),0,&str,local_b4,1,
                                flags,in_stack_ffffffffffffff48);
            if (iVar11 != 0) goto LAB_001070bc;
          }
          uVar18 = uVar18 + 1;
          lVar22 = lVar22 + 0x48;
        }
        lVar22 = 0;
        for (uVar18 = 0; uVar18 < ctx->group_count; uVar18 = uVar18 + 1) {
          pcVar6 = ctx->groups;
          if (((*(byte *)((long)&pcVar6->flags + lVar22) & 1) == 0) &&
             (*(long *)((long)&pcVar6->opt_count + lVar22) != 0)) {
            local_78 = (cargo_group_t *)((long)&pcVar6->name + lVar22);
            cVar1 = *local_78->name;
            if (cVar1 != '\0') {
              cargo_aappendf(&str,"\n%s:",*(undefined8 *)((long)&pcVar6->title + lVar22));
            }
            if (*(long *)((long)&pcVar6->description + lVar22) != 0) {
              cargo_aappendf(&str,"\n");
            }
            iVar11 = _cargo_get_group_description(ctx,&str,local_78,(int)uVar16);
            if (iVar11 != 0) goto LAB_001070bc;
            if (lVar20 != 0) {
              if ((cVar1 == '\0') &&
                 (iVar11 = cargo_aappendf(&str,"Positional arguments:\n"), iVar11 < 0))
              goto LAB_001070bc;
              uVar16 = 1;
              iVar11 = _cargo_print_options
                                 (ctx,*(size_t **)((long)&pcVar6->option_indices + lVar22),
                                  *(size_t *)((long)&pcVar6->opt_count + lVar22),1,&str,local_b4,0,
                                  flags,in_stack_ffffffffffffff48);
              if (iVar11 != 0) goto LAB_001070bc;
            }
            iVar11 = cargo_aappendf(&str,"\n");
            if (iVar11 < 0) goto LAB_001070bc;
            if (lVar19 != 0) {
              if ((cVar1 == '\0') && (iVar11 = cargo_aappendf(&str,"Options:\n"), iVar11 < 0))
              goto LAB_001070bc;
              uVar16 = 0;
              iVar11 = _cargo_print_options
                                 (ctx,*(size_t **)((long)&pcVar6->option_indices + lVar22),
                                  *(size_t *)((long)&pcVar6->opt_count + lVar22),0,&str,local_b4,0,
                                  flags,in_stack_ffffffffffffff48);
              if (iVar11 != 0) goto LAB_001070bc;
            }
          }
          lVar22 = lVar22 + 0x48;
        }
        pcVar5 = (cargo_t)ctx->epilog;
        if (((pcVar5 == (cargo_t)0x0) || ((flags & CARGO_USAGE_HIDE_EPILOG) != CARGO_USAGE_FULL)) ||
           (*(char *)&pcVar5->progname == '\0')) {
LAB_001070b2:
          pcVar13 = b;
          if (b != (char *)0x0) goto LAB_001070c9;
        }
        else if ((flags & CARGO_USAGE_RAW_EPILOG) == CARGO_USAGE_FULL) {
          pcVar13 = _cargo_linebreak(pcVar5,(char *)ctx->max_width,(size_t)pcVar5);
          if (pcVar13 != (char *)0x0) {
            cargo_aappendf(&str,"\n%s\n",pcVar13);
            _cargo_free(pcVar13);
            goto LAB_001070b2;
          }
        }
        else {
          iVar11 = cargo_aappendf(&str,"\n%s\n");
          pcVar13 = b;
          if (b != (char *)0x0 && -1 < iVar11) goto LAB_001070c9;
        }
      }
      else if ((flags & CARGO_USAGE_RAW_DESCRIPTION) == CARGO_USAGE_FULL) {
        pcVar13 = _cargo_linebreak(pcVar5,(char *)ctx->max_width,(size_t)pcVar5);
        if (pcVar13 != (char *)0x0) {
          cargo_aappendf(&str,"\n%s\n",pcVar13);
          _cargo_free(pcVar13);
          goto LAB_00106e2e;
        }
      }
      else {
        iVar11 = cargo_aappendf(&str,"\n%s\n");
        if (-1 < iVar11) goto LAB_00106e2e;
      }
    }
  }
LAB_001070bc:
  _cargo_xfree(&b);
  pcVar13 = (char *)0x0;
LAB_001070c9:
  _cargo_xfree(&ctx->usage);
  ctx->usage = pcVar13;
  return pcVar13;
}

Assistant:

const char *cargo_get_usage(cargo_t ctx, cargo_usage_t flags)
{
    char *ret = NULL;
    size_t i;
    char *b = NULL;
    int max_name_len = 0;
    size_t positional_count = 0;
    size_t option_count = 0;
    const char *short_usage = NULL;
    cargo_group_t *grp = NULL;
    cargo_astr_t str;
    int is_default_group = 1;
    assert(ctx);

    if (!(flags & CARGO_USAGE_HIDE_SHORT))
    {
        if (!(short_usage = _cargo_get_short_usage(ctx, flags)))
        {
            CARGODBG(1, "Failed to get short usage\n");
            return NULL;
        }
    }

    // Only show short usage.
    if (flags & CARGO_USAGE_SHORT)
    {
        return short_usage;
    }

    // TODO: Instead of looping over all options at this stage, save the length
    // of all options on add_option, including max_length, positional_count and
    // so on.

    // First get option names and their length.
    // We get the widest one so we know the column width to use
    // for the final result.
    //   --option_a         Some description.
    //   --longer_option_b  Another description...
    // ^-------------------^
    // What should the above width be.
    if ((max_name_len = _cargo_get_max_name_length(ctx,
                        &positional_count, &option_count)) < 0)
    {
        CARGODBG(1, "Failed to get option name max length\n");
        goto fail;
    }

    str.s = &b;
    str.l = 1024;
    str.offset = 0;

    // TODO: Break all this into separate functions.

    if (short_usage && !(flags & CARGO_USAGE_HIDE_SHORT))
    {
        cargo_aappendf(&str, "%s\n", short_usage);
    }

    if(ctx->description && strlen(ctx->description)
       && !(flags & CARGO_USAGE_HIDE_DESCRIPTION))
    {
        if (flags & CARGO_USAGE_RAW_DESCRIPTION)
        {
            if (cargo_aappendf(&str, "\n%s\n", ctx->description) < 0) goto fail;
        }
        else
        {
            char *lb_desc;
            if (!(lb_desc = _cargo_linebreak(ctx, ctx->description, ctx->max_width)))
            {
                goto fail;
            }
            cargo_aappendf(&str, "\n%s\n", lb_desc);
            _cargo_free(lb_desc);
        }
    }

    CARGODBG(2, "max_name_len = %d, ctx->max_width = %lu\n",
            max_name_len, ctx->max_width);

    #ifdef CARGO_DEBUG
    for (i = 0; i < ctx->group_count; i++)
    {
        CARGODBG(2, "%s: %lu\n",
            ctx->groups[i].name, ctx->groups[i].opt_count);
    }
    #endif

    // Start by printing mutually exclusive groups
    for (i = 0; i < ctx->mutex_group_count; i++)
    {
        int indent = 2;
        const char *description = NULL;
        grp = &ctx->mutex_groups[i];

        if (!(grp->flags & CARGO_MUTEXGRP_GROUP_USAGE))
        {
            continue;
        }

        if (grp->title)
        {
            cargo_aappendf(&str, "\n%s:\n", grp->title);
        }

        description = grp->description;

        if (!description)
        {
            description = "Specify one of the following.";
        }

        if (_cargo_get_group_description(ctx, &str, grp, indent))
        {
            goto fail;
        }

        // Positional.
        if (_cargo_print_options(ctx, grp->option_indices, grp->opt_count,
                                1, &str, max_name_len, indent, 1, flags))
        {
            goto fail;
        }

        // Options.
        if (_cargo_print_options(ctx, grp->option_indices, grp->opt_count,
                                0, &str, max_name_len, indent, 1, flags))
        {
            goto fail;
        }
    }

    for (i = 0; i < ctx->group_count; i++)
    {
        int indent = 2;
        grp = &ctx->groups[i];

        if ((grp->flags & CARGO_GROUP_HIDE) || (grp->opt_count == 0))
        {
            continue;
        }

        // The group name is always set for normal groups.
        // The default group is simply "".
        is_default_group = (strlen(grp->name) == 0);

        if (!is_default_group)
        {
            indent = 2;
        }

        if (!is_default_group) cargo_aappendf(&str, "\n%s:", grp->title);
        if (grp->description) cargo_aappendf(&str, "\n");

        if (_cargo_get_group_description(ctx, &str, grp, indent))
        {
            goto fail;
        }

        // Note, we only show the "Positional arguments" and "Options"
        // titles for the default group. It becomes quite spammy otherwise.
        if (positional_count > 0)
        {
            if (is_default_group)
                if (cargo_aappendf(&str, "Positional arguments:\n") < 0) goto fail;

            if (_cargo_print_options(ctx, grp->option_indices, grp->opt_count,
                                    1, &str, max_name_len, indent, 0, flags))
            {
                goto fail;
            }
        }

        if (cargo_aappendf(&str, "\n") < 0) goto fail;

        if (option_count > 0)
        {
            if (is_default_group)
                if (cargo_aappendf(&str, "Options:\n") < 0) goto fail;

            if (_cargo_print_options(ctx, grp->option_indices, grp->opt_count,
                                    0, &str, max_name_len, indent, 0, flags))
            {
                goto fail;
            }
        }
    }

    if(ctx->epilog && strlen(ctx->epilog)
       && !(flags & CARGO_USAGE_HIDE_EPILOG))
    {
        if (flags & CARGO_USAGE_RAW_EPILOG)
        {
            if (cargo_aappendf(&str, "\n%s\n", ctx->epilog) < 0) goto fail;
        }
        else
        {
            char *lb_epilog;
            if (!(lb_epilog = _cargo_linebreak(ctx, ctx->epilog, ctx->max_width)))
            {
                goto fail;
            }
            cargo_aappendf(&str, "\n%s\n", lb_epilog);
            _cargo_free(lb_epilog);
        }
    }

    // TODO: Realloc the buffer to minimize size.

    ret = b;

fail:
    // A real failure!
    if (!ret)
    {
        _cargo_xfree(&b);
    }

    // Save the usage and destroy it on exit,
    // we want the user to be able to do things like this:
    // printf("%s\nYou're bad at typing!\n", cargo_get_usage(cargo, 0));
    // without leaking memory.
    _cargo_xfree(&ctx->usage);

    ctx->usage = ret;

    return ret;
}